

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O3

void __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
          (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *this,
          DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
          *other)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined8 *puVar4;
  undefined8 uVar5;
  Matrix<double,__1,__1,_0,__1,__1> *rhs;
  ActualDstType actualDst;
  DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
  *lhs;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
  *other_1;
  
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  uVar1 = *(ulong *)(*(long *)other + 8);
  uVar2 = *(ulong *)(*(long *)(other + 8) + 0x10);
  if ((uVar2 != 0 && uVar1 != 0) &&
     (auVar3 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
     uVar5 = SUB168(auVar3 % SEXT816((long)uVar2),0), lhs = other,
     SUB168(auVar3 / SEXT816((long)uVar2),0) < (long)uVar1)) {
LAB_0014b4ae:
    puVar4 = (undefined8 *)__cxa_allocate_exception(8,lhs,uVar5);
    *puVar4 = std::random_device::_M_fini;
    __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  if (-1 < (long)(uVar2 | uVar1)) {
    DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)this,uVar2 * uVar1,uVar1,uVar2);
    lhs = *(DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
            **)other;
    rhs = *(Matrix<double,__1,__1,_0,__1,__1> **)(other + 8);
    uVar1 = *(ulong *)(lhs + 8);
    uVar2 = (rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols
    ;
    if ((*(ulong *)(this + 8) != uVar1) || (*(ulong *)(this + 0x10) != uVar2)) {
      if ((long)(uVar2 | uVar1) < 0) goto LAB_0014b48f;
      if ((uVar2 != 0 && uVar1 != 0) &&
         (auVar3 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
         uVar5 = SUB168(auVar3 % SEXT816((long)uVar2),0),
         SUB168(auVar3 / SEXT816((long)uVar2),0) < (long)uVar1)) goto LAB_0014b4ae;
      DenseStorage<double,_-1,_-1,_-1,_0>::resize
                ((DenseStorage<double,__1,__1,__1,_0> *)this,uVar2 * uVar1,uVar1,uVar2);
      lhs = *(DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
              **)other;
      rhs = *(Matrix<double,__1,__1,_0,__1,__1> **)(other + 8);
    }
    internal::
    generic_product_impl<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::DenseShape,Eigen::DenseShape,8>
    ::evalTo<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((Matrix<double,__1,__1,_0,__1,__1> *)this,(Matrix<double,__1,__1,_0,__1,__1> *)lhs,
               rhs);
    return;
  }
LAB_0014b48f:
  __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/PlainObjectBase.h"
                ,0x115,
                "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
               );
}

Assistant:

EIGEN_DEVICE_FUNC
    EIGEN_STRONG_INLINE PlainObjectBase(const DenseBase<OtherDerived> &other)
      : m_storage()
    {
      _check_template_params();
      resizeLike(other);
      _set_noalias(other);
    }